

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t * PAL_wcscpy(char16_t *strDestination,char16_t *strSource)

{
  char16_t *start;
  char16_t *strSource_local;
  char16_t *strDestination_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (strDestination == (char16_t *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    strDestination_local = (char16_t *)0x0;
  }
  else {
    start = strSource;
    strSource_local = strDestination;
    if (strSource == (char16_t *)0x0) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      strDestination_local = (char16_t *)0x0;
    }
    else {
      while (*start != L'\0') {
        *strSource_local = *start;
        start = start + 1;
        strSource_local = strSource_local + 1;
      }
      *strSource_local = L'\0';
      strDestination_local = strDestination;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  return strDestination_local;
}

Assistant:

char16_t *
__cdecl
PAL_wcscpy(
        char16_t *strDestination,
        const char16_t *strSource)
{
    char16_t *start = strDestination;

    PERF_ENTRY(wcscpy);
    ENTRY("wcscpy (strDestination=%p, strSource=%p (%S))\n",
          strDestination, strSource ? strSource:W16_NULLSTRING, strSource ? strSource:W16_NULLSTRING);

    if (strDestination == NULL)
    {
        ERROR("invalid strDestination argument\n");
        LOGEXIT("wcscpy returning char16_t NULL\n");
        PERF_EXIT(wcscpy);
        return NULL;
    }

    if (strSource == NULL)
    {
        ERROR("invalid strSource argument\n");
        LOGEXIT("wcscpy returning char16_t NULL\n");
        PERF_EXIT(wcscpy);
        return NULL;
    }

    /* copy source string to destination string */
    while(*strSource)
    {
        *strDestination++ = *strSource++;
    }

    /* add terminating null */
    *strDestination = char16_t(0);

    LOGEXIT("wcscpy returning char16_t %p (%S)\n", start, start);
    PERF_EXIT(wcscpy);
    return start;
}